

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::AC3DImporter::CanRead(AC3DImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  uint32_t token;
  string extension;
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"ac");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&extension,"ac3d");
    if (!bVar1) {
      bVar1 = std::operator==(&extension,"acc");
      if (!bVar1) {
        if (extension._M_string_length == 0 || checkSig) {
          token = 0x41433344;
          bVar2 = BaseImporter::CheckMagicToken(pIOHandler,pFile,&token,1,0,4);
        }
        else {
          bVar2 = false;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool AC3DImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    std::string extension = GetExtension(pFile);

    // fixme: are acc and ac3d *really* used? Some sources say they are
    if(extension == "ac" || extension == "ac3d" || extension == "acc") {
        return true;
    }
    if (!extension.length() || checkSig) {
        uint32_t token = AI_MAKE_MAGIC("AC3D");
        return CheckMagicToken(pIOHandler,pFile,&token,1,0);
    }
    return false;
}